

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture1D_GL.cpp
# Opt level: O0

void __thiscall
Diligent::Texture1D_GL::AttachToFramebuffer
          (Texture1D_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  GLenum GVar1;
  PFNGLFRAMEBUFFERTEXTURE1DPROC p_Var2;
  undefined4 uVar3;
  FRAMEBUFFER_TARGET_FLAGS FVar4;
  GLuint GVar5;
  Char *pCVar6;
  undefined4 in_register_0000000c;
  char (*Args_1) [99];
  undefined1 local_98 [8];
  string msg_2;
  undefined1 local_70 [4];
  GLenum err_1;
  string msg_1;
  GLenum err;
  undefined1 local_40 [8];
  string msg;
  FRAMEBUFFER_TARGET_FLAGS Targets_local;
  GLenum AttachmentPoint_local;
  TextureViewDesc *ViewDesc_local;
  Texture1D_GL *this_local;
  
  Args_1 = (char (*) [99])CONCAT44(in_register_0000000c,Targets);
  msg.field_2._8_4_ = Targets;
  msg.field_2._12_4_ = AttachmentPoint;
  FVar4 = Diligent::operator&(Targets,FRAMEBUFFER_TARGET_FLAG_DRAW);
  if (FVar4 != FRAMEBUFFER_TARGET_FLAG_NONE) {
    if ((ViewDesc->ViewType != TEXTURE_VIEW_RENDER_TARGET) &&
       (ViewDesc->ViewType != TEXTURE_VIEW_DEPTH_STENCIL)) {
      FormatString<char[26],char[99]>
                ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                 ,Args_1);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xb8);
      std::__cxx11::string::~string((string *)local_40);
    }
    uVar3 = msg.field_2._12_4_;
    p_Var2 = __glewFramebufferTexture1D;
    GVar1 = (this->super_TextureBaseGL).m_BindTarget;
    GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                      ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
    (*p_Var2)(0x8ca9,uVar3,GVar1,GVar5,ViewDesc->MostDetailedMip);
    msg_1.field_2._8_4_ = glGetError();
    if (msg_1.field_2._8_4_ != 0) {
      LogError<false,char[48],char[17],unsigned_int>
                (false,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xba,(char (*) [48])"Failed to attach texture 1D to draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_70,(char (*) [6])0xe8e72e);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xba);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  FVar4 = Diligent::operator&(msg.field_2._8_4_,FRAMEBUFFER_TARGET_FLAG_READ);
  uVar3 = msg.field_2._12_4_;
  p_Var2 = __glewFramebufferTexture1D;
  if (FVar4 != FRAMEBUFFER_TARGET_FLAG_NONE) {
    GVar1 = (this->super_TextureBaseGL).m_BindTarget;
    GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                      ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
    (*p_Var2)(0x8ca8,uVar3,GVar1,GVar5,ViewDesc->MostDetailedMip);
    msg_2.field_2._12_4_ = glGetError();
    if (msg_2.field_2._12_4_ != 0) {
      LogError<false,char[48],char[17],unsigned_int>
                (false,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xbf,(char (*) [48])"Failed to attach texture 1D to read framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_98,(char (*) [6])0xe8e72e);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1D_GL.cpp"
                 ,0xbf);
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  return;
}

Assistant:

void Texture1D_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    // For glFramebufferTexture1D(), if texture name is not zero, then texture target must be GL_TEXTURE_1D
    if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
    {
        VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
        glFramebufferTexture1D(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_BindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
        DEV_CHECK_GL_ERROR("Failed to attach texture 1D to draw framebuffer");
    }
    if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
    {
        glFramebufferTexture1D(GL_READ_FRAMEBUFFER, AttachmentPoint, m_BindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
        DEV_CHECK_GL_ERROR("Failed to attach texture 1D to read framebuffer");
    }
}